

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

void __thiscall TRM::Vertex::insert_below(Vertex *this,Edge *e)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  LinkedList<TRM::Edge> *pLVar5;
  Edge *pEVar6;
  Edge *pEVar7;
  Edge **ppEVar8;
  
  fVar1 = (e->bottom->point).field_0.x;
  fVar2 = (e->bottom->point).field_1.y;
  fVar3 = (e->top->point).field_0.x;
  fVar4 = (e->top->point).field_1.y;
  if (((fVar3 != fVar1 || fVar4 != fVar2) && (fVar4 <= fVar2)) &&
     ((fVar3 < fVar1 || fVar3 == fVar1) || fVar4 != fVar2)) {
    pEVar6 = (this->edge_below).head;
    if (pEVar6 == (Edge *)0x0) {
      pEVar7 = (Edge *)0x0;
LAB_0011c3ec:
      ppEVar8 = &(this->edge_below).tail;
      e->below_prev = pEVar7;
      e->below_next = (Edge *)0x0;
      pLVar5 = (LinkedList<TRM::Edge> *)&pEVar7->below_next;
      if (pEVar7 == (Edge *)0x0) {
        pLVar5 = &this->edge_below;
      }
      pLVar5->head = e;
    }
    else {
      if (0.0 <= pEVar6->le_a * (double)fVar1 + pEVar6->le_b * (double)fVar2 + pEVar6->le_c) {
        do {
          pEVar7 = pEVar6;
          pEVar6 = pEVar7->below_next;
          if (pEVar6 == (Edge *)0x0) goto LAB_0011c3ec;
        } while (0.0 <= pEVar6->le_a * (double)fVar1 + pEVar6->le_b * (double)fVar2 + pEVar6->le_c);
      }
      else {
        pEVar7 = (Edge *)0x0;
      }
      e->below_prev = pEVar7;
      pLVar5 = (LinkedList<TRM::Edge> *)&pEVar7->below_next;
      if (pEVar7 == (Edge *)0x0) {
        pLVar5 = &this->edge_below;
      }
      e->below_next = pEVar6;
      pLVar5->head = e;
      ppEVar8 = &pEVar6->below_prev;
    }
    *ppEVar8 = e;
  }
  return;
}

Assistant:

void Vertex::insert_below(Edge* e) {
  if (e->top->point == e->bottom->point ||                     // no edge
      VertexCompare::Compare(e->bottom->point, e->top->point)  // not below
  ) {
    return;
  }

  Edge* below_prev = nullptr;
  Edge* below_next = nullptr;

  for (below_next = edge_below.head; below_next != nullptr;
       below_next = below_next->below_next) {
    if (below_next->is_right_of(e->bottom->point)) {
      break;
    }

    below_prev = below_next;
  }

  LinkedList<Edge>::Insert<&Edge::below_prev, &Edge::below_next>(
      e, below_prev, below_next, &edge_below.head, &edge_below.tail);
}